

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,char *filename,bool compact)

{
  FILE *__stream;
  char *in_RSI;
  XMLDocument *in_RDI;
  FILE *fp;
  bool in_stack_00000127;
  FILE *in_stack_00000128;
  XMLDocument *in_stack_00000130;
  char *in_stack_ffffffffffffffc8;
  XMLError local_4;
  
  __stream = (FILE *)callfopen((char *)in_RDI,in_stack_ffffffffffffffc8);
  if (__stream == (FILE *)0x0) {
    SetError(in_RDI,XML_ERROR_FILE_COULD_NOT_BE_OPENED,in_RSI,(char *)0x0);
    local_4 = in_RDI->_errorID;
  }
  else {
    SaveFile(in_stack_00000130,in_stack_00000128,in_stack_00000127);
    fclose(__stream);
    local_4 = in_RDI->_errorID;
  }
  return local_4;
}

Assistant:

XMLError XMLDocument::SaveFile( const char* filename, bool compact )
{
    FILE* fp = callfopen( filename, "w" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, filename, 0 );
        return _errorID;
    }
    SaveFile(fp, compact);
    fclose( fp );
    return _errorID;
}